

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O3

bool qWidgetShortcutContextMatcher(QObject *object,ShortcutContext context)

{
  char cVar1;
  bool bVar2;
  undefined1 uVar3;
  QWidget *active_window;
  QWidget *pQVar4;
  long lVar5;
  long lVar6;
  QAction *a;
  QGraphicsWidget *w;
  QObject *pQVar7;
  
  active_window = QApplication::activeWindow();
  pQVar4 = QApplication::activePopupWidget();
  if (pQVar4 != (QWidget *)0x0) {
    active_window = QApplication::activePopupWidget();
  }
  if (active_window == (QWidget *)0x0) {
    lVar5 = QGuiApplication::focusWindow();
    if ((lVar5 == 0) || (cVar1 = QWindow::isActive(), cVar1 == '\0')) {
LAB_0039e1ba:
      active_window = (QWidget *)0x0;
    }
    else {
      active_window = (QWidget *)0x0;
      do {
        lVar6 = QMetaObject::cast((QObject *)&QWidgetWindow::staticMetaObject);
        if (lVar6 != 0) {
          if ((*(long *)(lVar6 + 0x28) == 0) || (*(int *)(*(long *)(lVar6 + 0x28) + 4) == 0))
          goto LAB_0039e1ba;
          active_window = *(QWidget **)(lVar6 + 0x30);
          break;
        }
        lVar5 = QWindow::parent(lVar5,0);
      } while (lVar5 != 0);
    }
  }
  a = (QAction *)QMetaObject::cast((QObject *)&QAction::staticMetaObject);
  if (a != (QAction *)0x0) {
    bVar2 = correctActionContext(context,a,active_window);
    return bVar2;
  }
  w = (QGraphicsWidget *)QMetaObject::cast((QObject *)&QGraphicsWidget::staticMetaObject);
  if (w != (QGraphicsWidget *)0x0) {
    bVar2 = correctGraphicsWidgetContext(context,w,active_window);
    return bVar2;
  }
  if (((object != (QObject *)0x0) &&
      (pQVar4 = (QWidget *)object, (*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0)) ||
     ((lVar5 = QMetaObject::cast((QObject *)&QShortcut::staticMetaObject), lVar5 != 0 &&
      ((pQVar4 = *(QWidget **)(*(long *)(lVar5 + 8) + 0x10), pQVar4 != (QWidget *)0x0 &&
       ((*(byte *)(*(long *)&pQVar4->field_0x8 + 0x30) & 1) != 0)))))) {
LAB_0039e28b:
    bVar2 = correctWidgetContext(context,pQVar4,active_window);
    return bVar2;
  }
  if ((object != (QObject *)0x0) &&
     (pQVar7 = object, (*(byte *)(*(long *)(object + 8) + 0x30) & 0x40) != 0)) {
    do {
      lVar5 = QMetaObject::cast((QObject *)&QWidgetWindow::staticMetaObject);
      if (lVar5 != 0) {
        if (((*(long *)(lVar5 + 0x28) != 0) && (*(int *)(*(long *)(lVar5 + 0x28) + 4) != 0)) &&
           (pQVar4 = *(QWidget **)(lVar5 + 0x30), *(QWidget **)(lVar5 + 0x30) != (QWidget *)0x0))
        goto LAB_0039e28b;
        break;
      }
      pQVar7 = (QObject *)QWindow::parent(pQVar7,0);
    } while (pQVar7 != (QObject *)0x0);
  }
  uVar3 = QShortcutPrivate::simpleContextMatcher(object,context);
  return (bool)uVar3;
}

Assistant:

bool qWidgetShortcutContextMatcher(QObject *object, Qt::ShortcutContext context)
{
    Q_ASSERT_X(object, "QShortcutMap", "Shortcut has no owner. Illegal map state!");

    QWidget *active_window = QApplication::activeWindow();

    // popups do not become the active window,
    // so we fake it here to get the correct context
    // for the shortcut system.
    if (QApplication::activePopupWidget())
        active_window = QApplication::activePopupWidget();

    if (!active_window) {
        QWindow *qwindow = QGuiApplication::focusWindow();
        if (qwindow && qwindow->isActive()) {
            while (qwindow) {
                if (auto widgetWindow = qobject_cast<QWidgetWindow *>(qwindow)) {
                    active_window = widgetWindow->widget();
                    break;
                }
                qwindow = qwindow->parent();
            }
        }
    }

#if QT_CONFIG(action)
    if (auto a = qobject_cast<QAction *>(object))
        return correctActionContext(context, a, active_window);
#endif

#if QT_CONFIG(graphicsview)
    if (auto gw = qobject_cast<QGraphicsWidget *>(object))
        return correctGraphicsWidgetContext(context, gw, active_window);
#endif

    auto w = qobject_cast<QWidget *>(object);
    if (!w) {
        if (auto s = qobject_cast<QShortcut *>(object))
            w = qobject_cast<QWidget *>(s->parent());
    }

    if (!w) {
        auto qwindow = qobject_cast<QWindow *>(object);
        while (qwindow) {
            if (auto widget_window = qobject_cast<QWidgetWindow *>(qwindow)) {
                w = widget_window->widget();
                break;
            }
            qwindow = qwindow->parent();
        }
    }

    if (w)
        return correctWidgetContext(context, w, active_window);

    return QShortcutPrivate::simpleContextMatcher(object, context);
}